

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O1

void WjTestLib_AddTest(WJTL_UNIT_TEST_FUNCTION TestFunction,char *TestName)

{
  WJTL_STATUS WVar1;
  WjtlTestList *pWVar2;
  char *pcVar3;
  WjtlTestList *pWVar4;
  WJTL_UNIT_TEST_FUNCTION unaff_RBX;
  WjtlGroupList *pWVar5;
  long lVar6;
  WjtlGroupList *unaff_R12;
  bool bVar7;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  uint64_t uStack_90;
  uint64_t uStack_88;
  uint64_t uStack_80;
  uint64_t uStack_78;
  WjtlGroupList *pWStack_70;
  uint64_t auStack_68 [2];
  WJTL_UNIT_TEST_FUNCTION p_Stack_58;
  WjtlGroupList *pWStack_50;
  
  if ((TestFunction == (WJTL_UNIT_TEST_FUNCTION)0x0) || (TestName == (char *)0x0)) {
    WjTestLib_AddTest_cold_1();
LAB_0011e0ce:
    WjTestLib_AddTest_cold_4();
  }
  else {
    if (gGroupListTail == (WjtlGroupList *)0x0) {
      WjTestLib_NewGroup("Default");
    }
    unaff_R12 = gGroupListTail;
    unaff_RBX = TestFunction;
    if (gGroupListTail == (WjtlGroupList *)0x0) goto LAB_0011e0ce;
    pWVar2 = (WjtlTestList *)calloc(1,0x50);
    if (pWVar2 != (WjtlTestList *)0x0) {
      pcVar3 = strdup(TestName);
      pWVar2->TestName = pcVar3;
      if (pcVar3 != (char *)0x0) {
        pWVar2->NumAsserts = 0;
        pWVar2->NumFailedAsserts = 0;
        pWVar2->NumAllocations = 0;
        pWVar2->NumDeallocations = 0;
        pWVar2->TestFunction = TestFunction;
        pWVar2->Next = (WjtlTestList *)0x0;
        pWVar4 = (WjtlTestList *)&unaff_R12->TestListHead;
        if (unaff_R12->TestListTail != (WjtlTestList *)0x0) {
          pWVar4 = unaff_R12->TestListTail;
        }
        pWVar4->Next = pWVar2;
        unaff_R12->TestListTail = pWVar2;
        return;
      }
      goto LAB_0011e0d8;
    }
  }
  WjTestLib_AddTest_cold_3();
LAB_0011e0d8:
  WjTestLib_AddTest_cold_2();
  pWVar5 = gGroupListHead;
  p_Stack_58 = unaff_RBX;
  pWStack_50 = unaff_R12;
  if (gGroupListHead != (WjtlGroupList *)0x0) {
    pWStack_70 = gGroupListHead;
    bVar7 = false;
    do {
      printf(":::::::: Test Group : %s ::::::::\n",pWVar5->GroupName);
      for (pWVar2 = pWVar5->TestListHead; pWVar2 != (WjtlTestList *)0x0; pWVar2 = pWVar2->Next) {
        printf(":::: Test : %s ::::\n",pWVar2->TestName);
        uStack_78 = 0;
        auStack_68[1] = 0;
        uStack_80 = 0;
        uStack_88 = 0;
        auStack_68[0] = 0;
        uStack_90 = 0;
        uStack_98 = 0;
        uStack_a0 = 0;
        WjTestLib_Memory_GetStats(&uStack_78,auStack_68 + 1,&uStack_80);
        WjTestLib_Asserts_Reset();
        WVar1 = (*pWVar2->TestFunction)();
        WjTestLib_Memory_GetStats(&uStack_88,auStack_68,&uStack_90);
        WjTestLib_Asserts_GetStats(&uStack_98,&uStack_a0);
        pWVar2->TestStatus = WVar1;
        pWVar2->NumAsserts = uStack_98;
        pWVar2->NumFailedAsserts = uStack_a0;
        if (uStack_a0 != 0) {
          printf("#### %lu Assert fails in test: %s\n",uStack_a0,pWVar2->TestName);
        }
        pWVar2->NumAllocations = uStack_88 - uStack_78;
        lVar6 = uStack_90 - uStack_80;
        pWVar2->NumMemLeaks = lVar6;
        if (lVar6 != 0) {
          printf("#### %lu Memory leaks in test: %s\n",lVar6,pWVar2->TestName);
        }
        bVar7 = true;
        pWVar5->GroupRun = true;
        pWVar2->TestRun = true;
      }
      pWVar5 = pWVar5->Next;
    } while (pWVar5 != (WjtlGroupList *)0x0);
    pWVar5 = pWStack_70;
    if (bVar7) {
      return;
    }
  }
  pcVar3 = "No test named: %s\n";
  if (pWVar5 == (WjtlGroupList *)0x0) {
    pcVar3 = "No group named: %s\n";
  }
  printf(pcVar3,0);
  return;
}

Assistant:

void
    WjTestLib_AddTest
    (
        WJTL_UNIT_TEST_FUNCTION     TestFunction,
        char const*                 TestName
    )
{
    if(     NULL != TestFunction
        &&  NULL != TestName )
    {
        if( NULL == gGroupListTail )
        {
            // No group created yet, so make a default one
            WjTestLib_NewGroup( "Default" );
        }

        if( NULL != gGroupListTail )
        {
            WjtlTestList* newTest = calloc( 1, sizeof(WjtlTestList) );
            if( NULL != newTest )
            {
                newTest->TestName = strdup( TestName );
                if( NULL != newTest->TestName )
                {
                    newTest->NumAllocations = 0;
                    newTest->NumDeallocations = 0;
                    newTest->NumAsserts = 0;
                    newTest->NumFailedAsserts = 0;
                    newTest->TestFunction = TestFunction;
                    newTest->Next = NULL;

                    if( NULL == gGroupListTail->TestListTail )
                    {
                        gGroupListTail->TestListHead = newTest;
                    }
                    else
                    {
                        gGroupListTail->TestListTail->Next = newTest;
                    }
                    gGroupListTail->TestListTail = newTest;
                }
                else
                {
                    InternalError( "Memory fail" );
                }
            }
            else
            {
                InternalError( "Memory fail" );
            }
        }
        else
        {
            InternalError( "Failed to create default group" );
        }
    }
    else
    {
        InternalError( "Invalid parameters" );
    }
}